

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O3

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::addMeshPoint
          (MultipleShootingTranscription *this,MeshPoint *newMeshPoint)

{
  size_t sVar1;
  anon_struct_112_6_78b70dfe *paVar2;
  
  paVar2 = (this->m_meshPointsEnd)._M_current;
  if (paVar2 == (this->m_meshPoints).
                super__Vector_base<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
    ::push_back(&this->m_meshPoints,newMeshPoint);
    paVar2 = (this->m_meshPoints).
             super__Vector_base<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    paVar2->type = newMeshPoint->type;
    paVar2->time = newMeshPoint->time;
    std::__cxx11::string::_M_assign((string *)&paVar2->origin);
    std::__cxx11::string::_M_assign((string *)&(paVar2->origin).m_description);
    (paVar2->origin).m_priority = (newMeshPoint->origin).m_priority;
    paVar2->stateIndex = newMeshPoint->stateIndex;
    sVar1 = newMeshPoint->previousControlIndex;
    paVar2->controlIndex = newMeshPoint->controlIndex;
    paVar2->previousControlIndex = sVar1;
    paVar2 = (this->m_meshPointsEnd)._M_current + 1;
  }
  (this->m_meshPointsEnd)._M_current = paVar2;
  return;
}

Assistant:

void addMeshPoint(MeshPoint& newMeshPoint){
                if (m_meshPointsEnd == m_meshPoints.end()){
                    m_meshPoints.push_back(newMeshPoint);
                    m_meshPointsEnd = m_meshPoints.end();
                } else {
                    *m_meshPointsEnd = newMeshPoint;
                    ++m_meshPointsEnd;
                }
            }